

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O2

cx_string<2UL> mserialize::cx_strcat<2ul>(cx_string<2UL> *strings)

{
  cx_string<2UL> local_10;
  char local_b;
  char local_a;
  undefined1 local_9;
  
  local_9 = 0;
  local_b = strings->_data[0];
  local_a = strings->_data[1];
  cx_string<2UL>::cx_string(&local_10,&local_b);
  return (cx_string<2UL>)local_10._data;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}